

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteConstant<double,double,double,duckdb::BinaryZeroIsNullWrapper,duckdb::ModuloOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  double dVar1;
  double __y;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  TemplatedValidityData<unsigned_long> *pTVar6;
  _Head_base<0UL,_unsigned_long_*,_false> _Var7;
  undefined4 uVar8;
  undefined4 uVar9;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  idx_t local_28;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pdVar3 = result->data;
  if (((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) &&
     ((puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar2 == (unsigned_long *)0x0 || ((*puVar2 & 1) != 0)))) {
    dVar1 = *(double *)left->data;
    uVar9 = (undefined4)((ulong)dVar1 >> 0x20);
    __y = *(double *)right->data;
    if ((__y != 0.0) || (NAN(__y))) {
      dVar1 = fmod(dVar1,__y);
      uVar8 = SUB84(dVar1,0);
      uVar9 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    else {
      _Var7._M_head_impl =
           (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (_Var7._M_head_impl == (unsigned_long *)0x0) {
        local_28 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)&local_38,&local_28);
        p_Var5 = p_Stack_30;
        peVar4 = local_38;
        local_38 = (element_type *)0x0;
        p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = peVar4;
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Var5;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
          }
        }
        pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                           (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data);
        _Var7._M_head_impl =
             (pTVar6->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             _Var7._M_head_impl;
      }
      uVar8 = SUB84(dVar1,0);
      *(byte *)_Var7._M_head_impl = (byte)*_Var7._M_head_impl & 0xfe;
    }
    *(ulong *)pdVar3 = CONCAT44(uVar9,uVar8);
    return;
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}